

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * diff(Bigint *a,Bigint *b)

{
  int iVar1;
  ulong uVar2;
  uint32 *puVar3;
  uint32 *puVar4;
  uint64 uVar5;
  uint64 y;
  uint64 borrow;
  uint32 *xc;
  uint32 *xbe;
  uint32 *xb;
  uint32 *xae;
  uint32 *xa;
  int local_30;
  int wb;
  int wa;
  int i;
  Bigint *c;
  Bigint *b_local;
  Bigint *a_local;
  
  iVar1 = cmp(a,b);
  if (iVar1 == 0) {
    a_local = Balloc(0);
    if (a_local == (Bigint *)0x0) {
      a_local = (Bigint *)0x0;
    }
    else {
      a_local->wds = 1;
      a_local->x[0] = 0;
    }
  }
  else {
    c = b;
    b_local = a;
    if (iVar1 < 0) {
      c = a;
      b_local = b;
    }
    wb = (int)(iVar1 < 0);
    a_local = Balloc(b_local->k);
    if (a_local == (Bigint *)0x0) {
      a_local = (Bigint *)0x0;
    }
    else {
      a_local->sign = wb;
      local_30 = b_local->wds;
      iVar1 = c->wds;
      y = 0;
      borrow = (uint64)a_local->x;
      xbe = c->x;
      xae = b_local->x;
      do {
        puVar3 = xae + 1;
        puVar4 = xbe + 1;
        uVar2 = ((ulong)*xae - (ulong)*xbe) - y;
        y = uVar2 >> 0x20 & 1;
        uVar5 = borrow + 4;
        *(int *)borrow = (int)uVar2;
        borrow = uVar5;
        xbe = puVar4;
        xae = puVar3;
      } while (puVar4 < c->x + iVar1);
      while (xae < b_local->x + local_30) {
        uVar2 = *xae - y;
        y = uVar2 >> 0x20 & 1;
        *(int *)borrow = (int)uVar2;
        borrow = borrow + 4;
        xae = xae + 1;
      }
      while (*(int *)(borrow - 4) == 0) {
        local_30 = local_30 + -1;
        borrow = borrow - 4;
      }
      a_local->wds = local_30;
    }
  }
  return a_local;
}

Assistant:

static Bigint *
diff(Bigint *a, Bigint *b)
{
    Bigint *c;
    int i, wa, wb;
    ULong *xa, *xae, *xb, *xbe, *xc;
#ifdef ULLong
    ULLong borrow, y;
#else
    ULong borrow, y;
    ULong z;
#endif

    i = cmp(a,b);
    if (!i) {
        c = Balloc(0);
        if (c == NULL)
            return NULL;
        c->wds = 1;
        c->x[0] = 0;
        return c;
    }
    if (i < 0) {
        c = a;
        a = b;
        b = c;
        i = 1;
    }
    else
        i = 0;
    c = Balloc(a->k);
    if (c == NULL)
        return NULL;
    c->sign = i;
    wa = a->wds;
    xa = a->x;
    xae = xa + wa;
    wb = b->wds;
    xb = b->x;
    xbe = xb + wb;
    xc = c->x;
    borrow = 0;
#ifdef ULLong
    do {
        y = (ULLong)*xa++ - *xb++ - borrow;
        borrow = y >> 32 & (ULong)1;
        *xc++ = (ULong)(y & FFFFFFFF);
    }
    while(xb < xbe);
    while(xa < xae) {
        y = *xa++ - borrow;
        borrow = y >> 32 & (ULong)1;
        *xc++ = (ULong)(y & FFFFFFFF);
    }
#else
    do {
        y = (*xa & 0xffff) - (*xb & 0xffff) - borrow;
        borrow = (y & 0x10000) >> 16;
        z = (*xa++ >> 16) - (*xb++ >> 16) - borrow;
        borrow = (z & 0x10000) >> 16;
        Storeinc(xc, z, y);
    }
    while(xb < xbe);
    while(xa < xae) {
        y = (*xa & 0xffff) - borrow;
        borrow = (y & 0x10000) >> 16;
        z = (*xa++ >> 16) - borrow;
        borrow = (z & 0x10000) >> 16;
        Storeinc(xc, z, y);
    }
#endif
    while(!*--xc)
        wa--;
    c->wds = wa;
    return c;
}